

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1WarpFilterTest_CheckOutput_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1WarpFilterTest_CheckOutput_Test> *this
          )

{
  AV1WarpFilterTest *this_00;
  
  WithParamInterface<std::tuple<std::tuple<int,int,int,void(*)(int_const*,unsigned_char_const*,int,int,int,unsigned_char*,int,int,int,int,int,int,int,ConvolveParams*,short,short,short,short)>,int,int,int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1WarpFilterTest *)operator_new(0x20);
  libaom_test::AV1WarpFilter::AV1WarpFilterTest::AV1WarpFilterTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<std::tuple<int,_int,_int,_void_(*)(const_int_*,_const_unsigned_char_*,_int,_int,_int,_unsigned_char_*,_int,_int,_int,_int,_int,_int,_int,_ConvolveParams_*,_short,_short,_short,_short)>,_int,_int,_int,_int>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__AV1WarpFilterTest_00f6af20;
  (this_00->
  super_TestWithParam<std::tuple<std::tuple<int,_int,_int,_void_(*)(const_int_*,_const_unsigned_char_*,_int,_int,_int,_unsigned_char_*,_int,_int,_int,_int,_int,_int,_int,_ConvolveParams_*,_short,_short,_short,_short)>,_int,_int,_int,_int>_>
  ).
  super_WithParamInterface<std::tuple<std::tuple<int,_int,_int,_void_(*)(const_int_*,_const_unsigned_char_*,_int,_int,_int,_unsigned_char_*,_int,_int,_int,_int,_int,_int,_int,_ConvolveParams_*,_short,_short,_short,_short)>,_int,_int,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AV1WarpFilterTest_CheckOutput_Test_00f6af60;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }